

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringOld
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  string *psVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  long lVar9;
  cmValue cVar10;
  size_t sVar11;
  ostream *poVar12;
  undefined7 in_register_00000009;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar13;
  _func_int **string;
  string_view str;
  cmCommandArgumentParserHelper parser;
  string input;
  undefined1 auStack_298 [8];
  string *local_290;
  string local_288;
  cmMakefile *local_268;
  undefined4 local_25c;
  RegularExpression *local_258;
  undefined1 local_250 [112];
  _Alloc_hider local_1e0;
  bool local_1ac;
  bool local_1ab;
  bool local_1aa;
  bool local_1a9;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  local_25c = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  local_290 = source;
  local_268 = this;
  lVar9 = std::__cxx11::string::find_first_of((char *)source,0x6c2e39,0);
  psVar5 = local_290;
  if (lVar9 == -1) {
    return LOG;
  }
  if (atOnly) {
    local_1a8._0_8_ = local_198;
    pcVar1 = (local_290->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar1,pcVar1 + local_290->_M_string_length);
    psVar5->_M_string_length = 0;
    *(psVar5->_M_dataplus)._M_p = '\0';
    local_258 = &local_268->cmAtVarRegex;
    string = (_func_int **)local_1a8._0_8_;
    while (bVar6 = cmsys::RegularExpression::find(local_258,(char *)string,&local_258->regmatch),
          bVar6) {
      pcVar2 = (local_268->cmAtVarRegex).regmatch.searchstring;
      pcVar3 = (local_268->cmAtVarRegex).regmatch.startp[0];
      pcVar4 = (local_268->cmAtVarRegex).regmatch.endp[0];
      std::__cxx11::string::append((char *)local_290,(ulong)string);
      lVar9 = (long)pcVar4 - (long)pcVar2;
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,(char *)((long)string + (long)(pcVar3 + (1 - (long)pcVar2))),
                 (long)string + lVar9 + -1);
      cVar10 = GetDefinition(local_268,(string *)local_250);
      if (cVar10.Value != (string *)0x0) {
        if ((char)local_25c == '\0') {
          std::__cxx11::string::_M_append
                    ((char *)local_290,(ulong)((cVar10.Value)->_M_dataplus)._M_p);
        }
        else {
          str._M_str = ((cVar10.Value)->_M_dataplus)._M_p;
          str._M_len = (cVar10.Value)->_M_string_length;
          cmEscapeQuotes_abi_cxx11_(&local_288,str);
          std::__cxx11::string::_M_append((char *)local_290,(ulong)local_288._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      string = (_func_int **)((long)string + lVar9);
    }
    std::__cxx11::string::append((char *)local_290);
    if ((_func_int **)local_1a8._0_8_ == local_198) {
      return LOG;
    }
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    return LOG;
  }
  cmCommandArgumentParserHelper::cmCommandArgumentParserHelper
            ((cmCommandArgumentParserHelper *)local_250);
  cmCommandArgumentParserHelper::SetMakefile((cmCommandArgumentParserHelper *)local_250,local_268);
  cmCommandArgumentParserHelper::SetLineFile
            ((cmCommandArgumentParserHelper *)local_250,line,filename);
  local_1ac = SUB41(local_25c,0);
  local_1aa = replaceAt;
  local_1a9 = removeEmpty;
  local_1ab = noEscapes;
  iVar7 = cmCommandArgumentParserHelper::ParseString
                    ((cmCommandArgumentParserHelper *)local_250,local_290,0);
  if ((iVar7 != 0) && (*local_1e0._M_p == '\0')) {
    MVar13 = LOG;
    std::__cxx11::string::_M_assign((string *)local_290);
    goto LAB_003fce72;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
  if (0 < line && filename != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    sVar11 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar12 = std::ostream::_M_insert<long>((long)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"when parsing string\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(local_290->_M_dataplus)._M_p,
                       local_290->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  if (local_1e0._M_p == (char *)0x0) {
    std::ios::clear((int)(auStack_298 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0xf0);
  }
  else {
    sVar11 = strlen(local_1e0._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1e0._M_p,sVar11);
  }
  MVar13 = FATAL_ERROR;
  if (iVar7 == 0) {
    PVar8 = cmStateSnapshot::GetPolicy(&local_268->StateSnapshot,CMP0010,false);
    if (PVar8 - REQUIRED_IF_USED < 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_288,(cmPolicies *)0xa,id_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_288._M_dataplus._M_p,local_288._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (PVar8 != OLD) {
        if (PVar8 != WARN) goto LAB_003fcd67;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_288,(cmPolicies *)0xa,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_288._M_dataplus._M_p,local_288._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
      }
      MVar13 = AUTHOR_WARNING;
    }
  }
LAB_003fcd67:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_003fce72:
  cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper
            ((cmCommandArgumentParserHelper *)local_250);
  return MVar13;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringOld(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // Fast path strings without any special characters.
  if (source.find_first_of("$@\\") == std::string::npos) {
    return MessageType::LOG;
  }

  // Special-case the @ONLY mode.
  if (atOnly) {
    // Store an original copy of the input.
    std::string input = source;

    // Start with empty output.
    source.clear();

    // Look for one @VAR@ at a time.
    const char* in = input.c_str();
    while (this->cmAtVarRegex.find(in)) {
      // Get the range of the string to replace.
      const char* first = in + this->cmAtVarRegex.start();
      const char* last = in + this->cmAtVarRegex.end();

      // Store the unchanged part of the string now.
      source.append(in, first - in);

      // Lookup the definition of VAR.
      std::string var(first + 1, last - first - 2);
      if (cmValue val = this->GetDefinition(var)) {
        // Store the value in the output escaping as requested.
        if (escapeQuotes) {
          source.append(cmEscapeQuotes(*val));
        } else {
          source.append(*val);
        }
      }

      // Continue looking for @VAR@ further along the string.
      in = last;
    }

    // Append the rest of the unchanged part of the string.
    source.append(in);

    return MessageType::LOG;
  }

  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  cmCommandArgumentParserHelper parser;
  parser.SetMakefile(this);
  parser.SetLineFile(line, filename);
  parser.SetEscapeQuotes(escapeQuotes);
  parser.SetNoEscapeMode(noEscapes);
  parser.SetReplaceAtSyntax(replaceAt);
  parser.SetRemoveEmpty(removeEmpty);
  int res = parser.ParseString(source, 0);
  const char* emsg = parser.GetError();
  MessageType mtype = MessageType::LOG;
  if (res && !emsg[0]) {
    source = parser.GetResult();
  } else {
    // Construct the main error message.
    std::ostringstream error;
    error << "Syntax error in cmake code ";
    if (filename && line > 0) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      error << "at\n"
            << "  " << filename << ":" << line << "\n";
    }
    error << "when parsing string\n"
          << "  " << source << "\n";
    error << emsg;

    // If the parser failed ("res" is false) then this is a real
    // argument parsing error, so the policy applies.  Otherwise the
    // parser reported an error message without failing because the
    // helper implementation is unhappy, which has always reported an
    // error.
    mtype = MessageType::FATAL_ERROR;
    if (!res) {
      // This is a real argument parsing error.  Use policy CMP0010 to
      // decide whether it is an error.
      switch (this->GetPolicyStatus(cmPolicies::CMP0010)) {
        case cmPolicies::WARN:
          error << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0010);
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          // OLD behavior is to just warn and continue.
          mtype = MessageType::AUTHOR_WARNING;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          error << "\n"
                << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0010);
          break;
        case cmPolicies::NEW:
          // NEW behavior is to report the error.
          break;
      }
    }
    errorstr = error.str();
  }
  return mtype;
}